

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O2

void * ihevc_buf_mgr_get_next_free(buf_mgr_t *ps_buf_mgr,WORD32 *pi4_buf_id)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)ps_buf_mgr->u4_max_buf_cnt;
  if ((int)ps_buf_mgr->u4_max_buf_cnt < 1) {
    uVar3 = uVar2;
  }
  do {
    if (uVar3 == uVar2) {
      return (void *)0x0;
    }
    if (ps_buf_mgr->au4_status[uVar2] == 0) {
      pvVar1 = ps_buf_mgr->apv_ptr[uVar2];
      if (pvVar1 != (void *)0x0) {
        *pi4_buf_id = (WORD32)uVar2;
        ps_buf_mgr->au4_status[uVar2] = 1;
        return pvVar1;
      }
    }
    else if (ps_buf_mgr->au4_status[uVar2] == 2) {
      __assert_fail("(ps_buf_mgr->au4_status[id] != 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_buf_mgr.c"
                    ,0xaa,"void *ihevc_buf_mgr_get_next_free(buf_mgr_t *, WORD32 *)");
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void* ihevc_buf_mgr_get_next_free(
                buf_mgr_t *ps_buf_mgr,
                WORD32 *pi4_buf_id)
{
    WORD32 id;
    void *pv_ret_ptr;

    pv_ret_ptr = NULL;
    for(id = 0; id < (WORD32)ps_buf_mgr->u4_max_buf_cnt; id++)
    {
        ASSERT(ps_buf_mgr->au4_status[id] != 2);

        /* Check if the buffer is non-null and status is zero */
        if((ps_buf_mgr->au4_status[id] == 0) && (ps_buf_mgr->apv_ptr[id]))
        {
            *pi4_buf_id = id;
            /* DEC is set to 1 */
            ps_buf_mgr->au4_status[id] = 1;
            pv_ret_ptr = ps_buf_mgr->apv_ptr[id];
            break;
        }
    }

    return pv_ret_ptr;
}